

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

SharedData * __thiscall
Clasp::MinimizeBuilder::createShared
          (MinimizeBuilder *this,SharedContext *ctx,SumVec *adjust,CmpWeight *cmp)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_type sVar4;
  MLit *__first;
  pointer pMVar5;
  WeightVec *pWVar6;
  bool bVar7;
  ulong uVar8;
  SharedMinimizeData *this_00;
  LevelWeight *x;
  ulong uVar9;
  uint local_68;
  size_type local_64;
  LevelWeight local_38;
  
  uVar1 = (this->lits_).ebo_.size;
  uVar8 = (ulong)uVar1;
  this_00 = (SharedMinimizeData *)operator_new((ulong)(uVar1 + 1) * 8 + 0x68);
  SharedMinimizeData::SharedMinimizeData(this_00,adjust,optimize);
  __first = (this->lits_).ebo_.buf;
  std::
  __stable_sort<Clasp::MinimizeBuilder::MLit*,__gnu_cxx::__ops::_Iter_comp_iter<Clasp::MinimizeBuilder::CmpWeight>>
            (__first,__first + (this->lits_).ebo_.size,
             (_Iter_comp_iter<Clasp::MinimizeBuilder::CmpWeight>)cmp->weights);
  uVar9 = 0;
  local_68 = 0;
  local_64 = 0;
  do {
    if (uVar9 == uVar8) {
      sVar4 = (this_00->weights).ebo_.size;
      *(undefined4 *)(&(((SharedMinimizeData *)(this_00[1].up_ + -1))->adjust_).ebo_.buf + uVar8) =
           0;
      *(size_type *)((long)this_00[1].up_ + uVar8 * 8 + -0xc) = sVar4;
      if (cmp->weights != (WeightVec *)0x0) {
        local_38._0_4_ = (adjust->ebo_).size - 1 & 0x7fffffff;
        local_38.weight = 0;
        bk_lib::
        pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
        ::push_back(&this_00->weights,&local_38);
      }
      SharedMinimizeData::resetBounds(this_00);
      return this_00;
    }
    pMVar5 = (this->lits_).ebo_.buf;
    uVar1 = pMVar5[uVar9].lit.rep_;
    uVar2 = pMVar5[uVar9].weight;
    SharedContext::setFrozen(ctx,uVar1 >> 2,true);
    *(uint *)(&(((SharedMinimizeData *)(this_00[1].up_ + -1))->adjust_).ebo_.buf + uVar9) = uVar1;
    *(uint *)((long)this_00[1].up_ + uVar9 * 8 + -0xc) = uVar2;
    pWVar6 = cmp->weights;
    if (pWVar6 != (WeightVec *)0x0) {
      if (uVar9 == 0) {
LAB_0014cc71:
        local_64 = (this_00->weights).ebo_.size;
        x = (pWVar6->ebo_).buf + uVar2;
        do {
          bk_lib::
          pod_vector<Clasp::SharedMinimizeData::LevelWeight,_std::allocator<Clasp::SharedMinimizeData::LevelWeight>_>
          ::push_back(&this_00->weights,x);
          iVar3 = *(int *)x;
          x = x + 1;
        } while (iVar3 < 0);
        local_68 = (uint)uVar9;
      }
      else {
        pMVar5 = (this->lits_).ebo_.buf;
        bVar7 = CmpWeight::operator()(cmp,pMVar5 + local_68,pMVar5 + uVar9);
        if (bVar7) goto LAB_0014cc71;
      }
      *(size_type *)((long)this_00[1].up_ + uVar9 * 8 + -0xc) = local_64;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

MinimizeBuilder::SharedData* MinimizeBuilder::createShared(SharedContext& ctx, const SumVec& adjust, const CmpWeight& cmp) {
	const uint32 nLits = static_cast<uint32>(lits_.size());
	SharedData*  ret   = new (::operator new(sizeof(SharedData) + ((nLits + 1)*sizeof(WeightLiteral)))) SharedData(adjust);
	// sort literals by decreasing weight
	std::stable_sort(lits_.begin(), lits_.end(), cmp);
	uint32   last = 0;
	weight_t wIdx = 0;
	for (uint32 i = 0; i != nLits; ++i) {
		WeightLiteral x(lits_[i].lit, lits_[i].weight);
		ctx.setFrozen(x.first.var(), true);
		ret->lits[i] = x;
		if (!cmp.weights) { continue; }
		if (!i || cmp(lits_[last], lits_[i])) {
			last = i;
			wIdx = (weight_t)ret->weights.size();
			for (const SharedData::LevelWeight* w = &(*cmp.weights)[x.second];; ++w) {
				ret->weights.push_back(*w);
				if (!w->next) { break; }
			}
		}
		ret->lits[i].second = wIdx;
	}
	ret->lits[nLits] = WeightLiteral(lit_true(), (weight_t)ret->weights.size());
	if (cmp.weights) {
		ret->weights.push_back(SharedData::LevelWeight((uint32)adjust.size()-1, 0));
	}
	ret->resetBounds();
	return ret;
}